

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallGraph.h
# Opt level: O1

FuncVec * __thiscall
dg::llvmdg::LazyLLVMCallGraph::getCalledFunctions(LazyLLVMCallGraph *this,CallInst *C)

{
  ulong uVar1;
  Function *pFVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  FuncVec *pFVar7;
  _Hash_node_base *p_Var8;
  Function *fun;
  CallInst *local_40;
  FuncVec local_38;
  Function *local_20;
  
  local_40 = C;
  pFVar2 = (Function *)llvm::Value::stripPointerCasts();
  local_38.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)(Function *)0x0;
  if (pFVar2[0x10] == (Function)0x0) {
    local_38.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)pFVar2;
  }
  if ((Function *)
      local_38.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start == (Function *)0x0) {
    uVar1 = (this->_funptrs).
            super_HashMapImpl<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>_>
            .
            super_unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
            ._M_h._M_bucket_count;
    uVar4 = (ulong)local_40 % uVar1;
    p_Var5 = (this->_funptrs).
             super_HashMapImpl<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>_>
             .
             super_unordered_map<const_llvm::CallInst_*,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>_>
             ._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var8 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_40 != (CallInst *)p_Var5->_M_nxt[1]._M_nxt))
    {
      while (p_Var5 = p_Var8, p_Var8 = p_Var5->_M_nxt, p_Var8 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)p_Var8[1]._M_nxt % uVar1 != uVar4) ||
           (p_Var6 = p_Var5, local_40 == (CallInst *)p_Var8[1]._M_nxt)) goto LAB_00121166;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_00121166:
    if (p_Var6 == (__node_base_ptr)0x0) {
      p_Var8 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var8 = p_Var6->_M_nxt;
    }
    if (p_Var8 == (_Hash_node_base *)0x0) {
      _getCalledFunctions(&local_38,this,local_40);
      pmVar3 = std::__detail::
               _Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_funptrs,&local_40);
      std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::_M_move_assign
                (pmVar3,&local_38);
      if ((Function *)
          local_38.
          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (Function *)0x0) {
        operator_delete(local_38.
                        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_38.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_38.
                              super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pFVar7 = std::__detail::
               _Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_llvm::CallInst_*,_std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>,_std::allocator<std::pair<const_llvm::CallInst_*const,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::CallInst_*>,_std::hash<const_llvm::CallInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_funptrs,&local_40);
    }
    else {
      pFVar7 = (FuncVec *)(p_Var8 + 2);
    }
  }
  else {
    if (getCalledFunctions(llvm::CallInst_const*)::retval == '\0') {
      getCalledFunctions();
    }
    pFVar7 = &getCalledFunctions::retval;
    if (getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      getCalledFunctions::retval.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getCalledFunctions::retval.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    if (getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        getCalledFunctions::retval.
        super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>::
      _M_realloc_insert<llvm::Function_const*const&>
                ((vector<llvm::Function_const*,std::allocator<llvm::Function_const*>> *)
                 &getCalledFunctions::retval,
                 (iterator)
                 getCalledFunctions::retval.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(Function **)&local_38);
    }
    else {
      *getCalledFunctions::retval.
       super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (Function *)
           local_38.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_start;
      getCalledFunctions::retval.
      super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           getCalledFunctions::retval.
           super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_20 = *(Function **)(*(long *)&(local_40->super_CallBase).field_0x28 + 0x38);
    GenericCallGraph<const_llvm::Function_*>::addCall(&this->_cg,&local_20,(Function **)&local_38);
  }
  return pFVar7;
}

Assistant:

const FuncVec &getCalledFunctions(const llvm::CallInst *C) {
        auto *val = _getCalledValue(C);
        if (auto *fun = llvm::dyn_cast<llvm::Function>(val)) {
            static FuncVec retval;
            retval.clear();
            retval.push_back(fun);
            _cg.addCall(C->getParent()->getParent(), fun);
            return retval;
        }

        auto it = _funptrs.find(C);
        if (it != _funptrs.end()) {
            return it->second;
        }

        // FIXME: do not do multiple lookups
        _funptrs[C] = _getCalledFunctions(C);
        return _funptrs[C];
    }